

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int push_all(mg_context *ctx,FILE *fp,SOCKET sock,SSL *ssl,char *buf,int len)

{
  char *__nptr;
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  undefined4 in_register_00000014;
  uint uVar7;
  size_t __n;
  stop_flag_t *stop_flag;
  uint uVar8;
  SSL *__buf;
  timespec tsnow;
  double local_78;
  timespec local_68;
  ulong local_58;
  long local_50;
  long local_48;
  ulong local_40;
  SSL *local_38;
  
  if (ctx == (mg_context *)0x0) {
    return -1;
  }
  __n = (ulong)buf & 0xffffffff;
  __nptr = (ctx->dd).config[0xb];
  if (__nptr != (char *)0x0) {
    iVar3 = atoi(__nptr);
    local_78 = (double)iVar3 / 1000.0;
    if (0.0 < local_78) goto LAB_0010db9d;
  }
  local_78 = strtod("30000",(char **)0x0);
  local_78 = local_78 / 1000.0;
LAB_0010db9d:
  if ((int)buf < 1) {
    return 0;
  }
  stop_flag = &ctx->stop_flag;
  local_40 = (ulong)(local_78 * 1000000000.0);
  local_40 = (long)(local_78 * 1000000000.0 - 9.223372036854776e+18) & (long)local_40 >> 0x3f |
             local_40;
  uVar8 = 0;
  local_48 = CONCAT44(in_register_00000014,sock);
  local_38 = ssl;
LAB_0010dbec:
  lVar1 = local_48;
  if (*stop_flag != 0) {
    return uVar8;
  }
  if (local_78 <= 0.0) {
    local_58 = 0;
    local_50 = 0;
  }
  else {
    clock_gettime(0,&local_68);
    local_50 = CONCAT26(local_68.tv_sec._6_2_,CONCAT24(local_68.tv_sec._4_2_,(int)local_68.tv_sec))
               * -1000000000 - local_68.tv_nsec;
    local_58 = local_40;
  }
  if (lVar1 != 0) {
    return -1;
  }
  __buf = local_38 + uVar8;
  iVar3 = (int)__n;
LAB_0010dc58:
  sVar5 = send((int)fp,__buf,__n,0x4000);
  iVar4 = (int)sVar5;
  if (iVar4 < 0) {
    piVar6 = __errno_location();
    if (((*piVar6 != 4) && (*piVar6 != 0xb)) || (*stop_flag != 0)) goto LAB_0010dd3c;
  }
  else {
    if (*stop_flag != 0) goto LAB_0010dd3c;
    if (iVar4 != 0) goto LAB_0010dd26;
  }
  local_68.tv_sec._4_2_ = 4;
  local_68.tv_sec._0_4_ = (int)fp;
  iVar4 = mg_poll((pollfd *)&local_68,1,200,stop_flag);
  cVar2 = (0 < iVar4) * '\x03';
  if (*stop_flag != 0) {
    cVar2 = '\x01';
  }
  if ((cVar2 != '\x03') &&
     ((cVar2 != '\0' ||
      ((0.0 < local_78 &&
       (clock_gettime(0,&local_68),
       local_58 <
       (ulong)(local_68.tv_nsec + local_50 +
              CONCAT26(local_68.tv_sec._6_2_,CONCAT24(local_68.tv_sec._4_2_,(int)local_68.tv_sec)) *
              1000000000))))))) {
LAB_0010dd3c:
    if (uVar8 != 0) {
      return uVar8;
    }
    return -1;
  }
  goto LAB_0010dc58;
LAB_0010dd26:
  uVar8 = uVar8 + iVar4;
  uVar7 = iVar3 - iVar4;
  __n = (size_t)uVar7;
  if (uVar7 == 0 || iVar3 < iVar4) {
    return uVar8;
  }
  goto LAB_0010dbec;
}

Assistant:

static int
push_all(struct mg_context *ctx,
         FILE *fp,
         SOCKET sock,
         SSL *ssl,
         const char *buf,
         int len)
{
	double timeout = -1.0;
	int n, nwritten = 0;

	if (ctx == NULL) {
		return -1;
	}

	if (ctx->dd.config[REQUEST_TIMEOUT]) {
		timeout = atoi(ctx->dd.config[REQUEST_TIMEOUT]) / 1000.0;
	}
	if (timeout <= 0.0) {
		timeout = strtod(config_options[REQUEST_TIMEOUT].default_value, NULL)
		          / 1000.0;
	}

	while ((len > 0) && STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		n = push_inner(ctx, fp, sock, ssl, buf + nwritten, len, timeout);
		if (n < 0) {
			if (nwritten == 0) {
				nwritten = -1; /* Propagate the error */
			}
			break;
		} else if (n == 0) {
			break; /* No more data to write */
		} else {
			nwritten += n;
			len -= n;
		}
	}

	return nwritten;
}